

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     TersePrintPrefixToStrings<std::tuple<google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>,2ul>
               (long t,vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_2)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream local_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  TersePrintPrefixToStrings<std::tuple<google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>,1ul>
            ();
  std::__cxx11::stringstream::stringstream(local_198);
  std::ostream::operator<<(local_188,*(int *)(t + 8));
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_2,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void TersePrintPrefixToStrings(const Tuple& t,
                               std::integral_constant<size_t, I>,
                               Strings* strings) {
  TersePrintPrefixToStrings(t, std::integral_constant<size_t, I - 1>(),
                            strings);
  ::std::stringstream ss;
  UniversalTersePrint(std::get<I - 1>(t), &ss);
  strings->push_back(ss.str());
}